

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O0

int Cbs_ManSolve_rec(Cbs_Man_t *p,int Level)

{
  Gia_Man_t *pGVar1;
  Cbs_Man_t *p_00;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  int local_50;
  int local_4c;
  int iJustTail;
  int iJustHead;
  int iPropHead;
  int hLearn1;
  int hLearn0;
  int hClause;
  Gia_Obj_t *pDecVar;
  Gia_Obj_t *pVar;
  Cbs_Que_t *pQue;
  Cbs_Man_t *pCStack_18;
  int Level_local;
  Cbs_Man_t *p_local;
  
  pVar = (Gia_Obj_t *)&p->pClauses;
  pQue._4_4_ = Level;
  pCStack_18 = p;
  iVar2 = Cbs_QueIsEmpty(&p->pProp);
  if (iVar2 != 0) {
    __assert_fail("!Cbs_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCSat.c"
                  ,0x363,"int Cbs_ManSolve_rec(Cbs_Man_t *, int)");
  }
  hLearn1 = Cbs_ManPropagate(pCStack_18,pQue._4_4_);
  p_local._4_4_ = hLearn1;
  if (hLearn1 == 0) {
    iVar2 = Cbs_QueIsEmpty(&pCStack_18->pProp);
    if (iVar2 == 0) {
      __assert_fail("Cbs_QueIsEmpty(&p->pProp)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCSat.c"
                    ,0x367,"int Cbs_ManSolve_rec(Cbs_Man_t *, int)");
    }
    iVar2 = Cbs_QueIsEmpty(&pCStack_18->pJust);
    if (iVar2 == 0) {
      iVar2 = Abc_MaxInt((pCStack_18->Pars).nJustThis,
                         (pCStack_18->pJust).iTail - (pCStack_18->pJust).iHead);
      (pCStack_18->Pars).nJustThis = iVar2;
      iVar2 = Cbs_ManCheckLimits(pCStack_18);
      if (iVar2 == 0) {
        iJustTail = (pCStack_18->pProp).iHead;
        Cbs_QueStore(&pCStack_18->pJust,&local_4c,&local_50);
        if ((pCStack_18->Pars).fUseHighest == 0) {
          if ((pCStack_18->Pars).fUseLowest == 0) {
            if ((pCStack_18->Pars).fUseMaxFF == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCSat.c"
                            ,0x378,"int Cbs_ManSolve_rec(Cbs_Man_t *, int)");
            }
            pDecVar = Cbs_ManDecideMaxFF(pCStack_18);
          }
          else {
            pDecVar = Cbs_ManDecideLowest(pCStack_18);
          }
        }
        else {
          pDecVar = Cbs_ManDecideHighest(pCStack_18);
        }
        iVar2 = Cbs_VarIsJust(pDecVar);
        if (iVar2 == 0) {
          __assert_fail("Cbs_VarIsJust( pVar )",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCSat.c"
                        ,0x379,"int Cbs_ManSolve_rec(Cbs_Man_t *, int)");
        }
        pGVar1 = pCStack_18->pAig;
        pGVar4 = Gia_ObjFanin0(pDecVar);
        iVar2 = Gia_ObjRefNum(pGVar1,pGVar4);
        pGVar1 = pCStack_18->pAig;
        pGVar4 = Gia_ObjFanin1(pDecVar);
        iVar3 = Gia_ObjRefNum(pGVar1,pGVar4);
        if (iVar3 < iVar2) {
          pGVar4 = Gia_ObjChild0(pDecVar);
          _hLearn0 = Gia_Not(pGVar4);
        }
        else {
          pGVar4 = Gia_ObjChild1(pDecVar);
          _hLearn0 = Gia_Not(pGVar4);
        }
        Cbs_ManAssign(pCStack_18,_hLearn0,pQue._4_4_ + 1,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
        iPropHead = Cbs_ManSolve_rec(pCStack_18,pQue._4_4_ + 1);
        if (iPropHead == 0) {
          p_local._4_4_ = 0;
        }
        else {
          pGVar4 = *(Gia_Obj_t **)(*(long *)&pVar[1].field_0x4 + (long)iPropHead * 8);
          pGVar5 = Gia_Regular(_hLearn0);
          if (pGVar4 == pGVar5) {
            Cbs_ManCancelUntil(pCStack_18,iJustTail);
            Cbs_QueRestore(&pCStack_18->pJust,local_4c,local_50);
            p_00 = pCStack_18;
            pGVar4 = Gia_Not(_hLearn0);
            Cbs_ManAssign(p_00,pGVar4,pQue._4_4_ + 1,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
            iJustHead = Cbs_ManSolve_rec(pCStack_18,pQue._4_4_ + 1);
            if (iJustHead == 0) {
              p_local._4_4_ = 0;
            }
            else {
              pGVar4 = *(Gia_Obj_t **)(*(long *)&pVar[1].field_0x4 + (long)iJustHead * 8);
              pGVar5 = Gia_Regular(_hLearn0);
              if (pGVar4 == pGVar5) {
                p_local._4_4_ = Cbs_ManResolve(pCStack_18,pQue._4_4_,iPropHead,iJustHead);
                (pCStack_18->Pars).nBTThis = (pCStack_18->Pars).nBTThis + 1;
              }
              else {
                p_local._4_4_ = iJustHead;
              }
            }
          }
          else {
            p_local._4_4_ = iPropHead;
          }
        }
      }
      else {
        p_local._4_4_ = 0;
      }
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Cbs_ManSolve_rec( Cbs_Man_t * p, int Level )
{ 
    Cbs_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pVar, * pDecVar;
    int hClause, hLearn0, hLearn1;
    int iPropHead, iJustHead, iJustTail;
    // propagate assignments
    assert( !Cbs_QueIsEmpty(&p->pProp) );
    if ( (hClause = Cbs_ManPropagate( p, Level )) )
        return hClause;
    // check for satisfying assignment
    assert( Cbs_QueIsEmpty(&p->pProp) );
    if ( Cbs_QueIsEmpty(&p->pJust) )
        return 0;
    // quit using resource limits
    p->Pars.nJustThis = Abc_MaxInt( p->Pars.nJustThis, p->pJust.iTail - p->pJust.iHead );
    if ( Cbs_ManCheckLimits( p ) )
        return 0;
    // remember the state before branching
    iPropHead = p->pProp.iHead;
    Cbs_QueStore( &p->pJust, &iJustHead, &iJustTail );
    // find the decision variable
    if ( p->Pars.fUseHighest )
        pVar = Cbs_ManDecideHighest( p );
    else if ( p->Pars.fUseLowest )
        pVar = Cbs_ManDecideLowest( p );
    else if ( p->Pars.fUseMaxFF )
        pVar = Cbs_ManDecideMaxFF( p );
    else assert( 0 );
    assert( Cbs_VarIsJust( pVar ) );
    // chose decision variable using fanout count
    if ( Gia_ObjRefNum(p->pAig, Gia_ObjFanin0(pVar)) > Gia_ObjRefNum(p->pAig, Gia_ObjFanin1(pVar)) )
        pDecVar = Gia_Not(Gia_ObjChild0(pVar));
    else
        pDecVar = Gia_Not(Gia_ObjChild1(pVar));
//    pDecVar = Gia_NotCond( Gia_Regular(pDecVar), Gia_Regular(pDecVar)->fPhase );
//    pDecVar = Gia_Not(pDecVar);
    // decide on first fanin
    Cbs_ManAssign( p, pDecVar, Level+1, NULL, NULL );
    if ( !(hLearn0 = Cbs_ManSolve_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn0] != Gia_Regular(pDecVar) )
        return hLearn0;
    Cbs_ManCancelUntil( p, iPropHead );
    Cbs_QueRestore( &p->pJust, iJustHead, iJustTail );
    // decide on second fanin
    Cbs_ManAssign( p, Gia_Not(pDecVar), Level+1, NULL, NULL );
    if ( !(hLearn1 = Cbs_ManSolve_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn1] != Gia_Regular(pDecVar) )
        return hLearn1;
    hClause = Cbs_ManResolve( p, Level, hLearn0, hLearn1 );
//    Cbs_ManPrintClauseNew( p, Level, hClause );
//    if ( Level > Cbs_ClauseDecLevel(p, hClause) )
//        p->Pars.nBTThisNc++;
    p->Pars.nBTThis++;
    return hClause;
}